

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O2

stStateUI * __thiscall TripleBuffer<stStateUI>::get(TripleBuffer<stStateUI> *this)

{
  std::mutex::lock(&this->mutex);
  if (this->hasChanged == true) {
    stStateUI::operator=(&this->out,&this->buffer);
    this->hasChanged = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return &this->out;
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }